

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

_Bool is_name_only(char *path)

{
  char *pcVar1;
  _Bool _Var2;
  int iVar3;
  __int32_t **pp_Var4;
  char temp [260];
  char ext [260];
  char fname [260];
  char current_dir [260];
  char local_448 [272];
  char local_338 [272];
  char local_228 [272];
  char local_118 [264];
  
  if (*path == '\0') {
    return false;
  }
  get_dir(path,local_118);
  get_fname(path,local_228);
  get_ext(path,local_338);
  _Var2 = false;
  if ((local_118[0] == '\0') && (_Var2 = false, local_228[0] != '\0')) {
    if (local_338[0] != '\0') {
      strcpy(local_448,local_338);
      if (local_448[0] != '\0') {
        pp_Var4 = __ctype_tolower_loc();
        pcVar1 = local_448;
        do {
          *pcVar1 = (char)(*pp_Var4)[local_448[0]];
          local_448[0] = pcVar1[1];
          pcVar1 = pcVar1 + 1;
        } while (local_448[0] != '\0');
      }
      iVar3 = strcmp(local_448,G_VOICE_EXT);
      if (iVar3 == 0) {
        return false;
      }
    }
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

bool is_name_only(const char *path)
{
	if (strlen(path) == 0)
	{
		return false;
	}
	char drive[MAX_PATH];
	char current_dir[MAX_PATH];
	char fname[MAX_PATH];
	char ext[MAX_PATH];
	split_path(path, drive, current_dir, fname, ext);
#if defined(_WIN32)
	if (strlen(drive) != 0)
	{
		return false;
	}
#endif
	if (strlen(current_dir) != 0)
	{
		return false;
	}
	if (strlen(fname) == 0)
	{
		return false;
	}
	if (strlen(ext) != 0)
	{
		char temp[MAX_PATH];
		strcpy(temp, ext);
		char *p;
		for (p = temp; *p; p++)
		{
			*p = tolower(*p);
		}
		if (strcmp(temp, G_VOICE_EXT) == 0)
		{
			return false;
		}
	}
	return true;
}